

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

Attribute * __thiscall Assimp::CFIReaderImpl::getAttributeByName(CFIReaderImpl *this,char *name)

{
  Attribute *pAVar1;
  long *__s2;
  int iVar2;
  size_t sVar3;
  Attribute *pAVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  string n;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  if (name == (char *)0x0) {
    pAVar4 = (Attribute *)0x0;
  }
  else {
    local_50 = local_40;
    sVar3 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + sVar3);
    __s2 = local_50;
    pAVar1 = (this->attributes).
             super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (int)((long)(this->attributes).
                        super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 4) * 0x38e38e39
    ;
    if ((int)uVar5 < 1) {
      pAVar4 = (Attribute *)0x0;
    }
    else {
      uVar6 = (ulong)(uVar5 & 0x7fffffff);
      lVar7 = 0;
      pAVar4 = pAVar1;
      do {
        sVar3 = (pAVar4->name)._M_string_length;
        if (sVar3 == local_48) {
          if (sVar3 == 0) goto LAB_00657ad6;
          iVar2 = bcmp((pAVar4->name)._M_dataplus._M_p,__s2,sVar3);
          if (iVar2 == 0) {
            pAVar4 = pAVar1 + lVar7;
            goto LAB_00657ad6;
          }
        }
        lVar7 = lVar7 + 1;
        pAVar4 = pAVar4 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      pAVar4 = (Attribute *)0x0;
    }
LAB_00657ad6:
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  return pAVar4;
}

Assistant:

const Attribute* getAttributeByName(const char* name) const {
        if (!name) {
            return 0;
        }
        std::string n = name;
        for (int i=0; i<(int)attributes.size(); ++i) {
            if (attributes[i].name == n) {
                return &attributes[i];
            }
        }
        return 0;
    }